

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_base64_decode(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int nLen_00;
  long lVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  char local_3e;
  byte local_3d;
  byte local_3c;
  int nLen;
  
  if (0 < nArg) {
    pcVar2 = jx9_value_to_string(*apArg,&nLen);
    lVar1 = (long)nLen;
    if (0 < (long)nLen) {
      do {
        lVar5 = lVar1;
        if (lVar5 == 0) {
          lVar5 = 0;
          break;
        }
        lVar1 = lVar5 + -1;
      } while (pcVar2[lVar5 + -1] == '=');
      uVar6 = 1;
      while( true ) {
        uVar3 = uVar6 - 1;
        uVar4 = (uint)lVar5;
        if (uVar4 <= uVar6 + 2) break;
        local_3e = ((byte)(*(uint *)(SyBase64Decode_aBase64Trans +
                                    (ulong)((byte)pcVar2[uVar6] & 0x7f) * 4) >> 4) & 3) +
                   (char)*(undefined4 *)
                          (SyBase64Decode_aBase64Trans + (ulong)((byte)pcVar2[uVar3] & 0x7f) * 4) *
                   '\x04';
        local_3d = (byte)(*(uint *)(SyBase64Decode_aBase64Trans +
                                   (ulong)((byte)pcVar2[uVar6 + 1] & 0x7f) * 4) >> 2) & 0xf |
                   (byte)(*(uint *)(SyBase64Decode_aBase64Trans +
                                   (ulong)((byte)pcVar2[uVar6] & 0x7f) * 4) << 4);
        local_3c = (byte)*(undefined4 *)
                          (SyBase64Decode_aBase64Trans + (ulong)((byte)pcVar2[uVar6 + 2] & 0x7f) * 4
                          ) & 0x3f |
                   (byte)(*(uint *)(SyBase64Decode_aBase64Trans +
                                   (ulong)((byte)pcVar2[uVar6 + 1] & 0x7f) * 4) << 6);
        jx9_result_string(pCtx,&local_3e,3);
        uVar6 = uVar6 + 4;
      }
      if (uVar6 + 1 < uVar4) {
        local_3e = ((byte)(*(uint *)(SyBase64Decode_aBase64Trans +
                                    (ulong)((byte)pcVar2[uVar6] & 0x7f) * 4) >> 4) & 3) +
                   (char)*(undefined4 *)
                          (SyBase64Decode_aBase64Trans + (ulong)((byte)pcVar2[uVar3] & 0x7f) * 4) *
                   '\x04';
        local_3d = (byte)(*(uint *)(SyBase64Decode_aBase64Trans +
                                   (ulong)((byte)pcVar2[uVar6 + 1] & 0x7f) * 4) >> 2) & 0xf |
                   (byte)(*(uint *)(SyBase64Decode_aBase64Trans +
                                   (ulong)((byte)pcVar2[uVar6] & 0x7f) * 4) << 4);
        nLen_00 = 2;
      }
      else {
        if (uVar4 <= uVar6) {
          return 0;
        }
        local_3e = ((byte)(*(uint *)(SyBase64Decode_aBase64Trans +
                                    (ulong)((byte)pcVar2[uVar6] & 0x7f) * 4) >> 4) & 3) +
                   (char)*(undefined4 *)
                          (SyBase64Decode_aBase64Trans + (ulong)((byte)pcVar2[uVar3] & 0x7f) * 4) *
                   '\x04';
        nLen_00 = 1;
      }
      jx9_result_string(pCtx,&local_3e,nLen_00);
      return 0;
    }
  }
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9Builtin_base64_decode(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIn;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the input string */
	zIn = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Nothing to process, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the BASE64 decoding */
	SyBase64Decode(zIn, (sxu32)nLen, Consumer, pCtx);
	return JX9_OK;
}